

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

MPP_RET mpp_enc_refs_set_usr_cfg(MppEncRefs refs,MppEncRefFrmUsrCfg *cfg)

{
  MppEncRefsImpl *p;
  MppEncRefFrmUsrCfg *cfg_local;
  MppEncRefs refs_local;
  
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_set_usr_cfg");
    refs_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_set_usr_cfg",refs);
    }
    *(undefined8 *)((long)refs + 0x10) = *(undefined8 *)cfg;
    *(undefined8 *)((long)refs + 0x18) = *(undefined8 *)&cfg->force_pskip;
    *(undefined8 *)((long)refs + 0x20) = *(undefined8 *)&cfg->force_lt_idx;
    *(undefined8 *)((long)refs + 0x28) = *(undefined8 *)&cfg->force_ref_mode;
    if (cfg->force_flag != 0) {
      *(uint *)refs = *refs | 2;
    }
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_set_usr_cfg",refs);
    }
    refs_local._4_4_ = MPP_OK;
  }
  return refs_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_refs_set_usr_cfg(MppEncRefs refs, MppEncRefFrmUsrCfg *cfg)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    memcpy(&p->usr_cfg, cfg, sizeof(p->usr_cfg));
    if (cfg->force_flag)
        p->changed |= ENC_REFS_USR_CFG_CHANGED;

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}